

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O0

int __thiscall Intel_V4L2::init_device(Intel_V4L2 *this)

{
  int iVar1;
  uchar *puVar2;
  v4l2_buffer *pvVar3;
  undefined4 local_288;
  undefined4 local_284;
  v4l2_buffer buf;
  v4l2_streamparm streamParm;
  v4l2_requestbuffers req;
  v4l2_format fmt;
  v4l2_capability cap;
  Intel_V4L2 *this_local;
  
  iVar1 = open("/dev/video1",2);
  this->m_fd = iVar1;
  if (this->m_fd < 0) {
    perror("Intel_V4L2::init_device : failed to open /dev/video1");
    this_local._4_4_ = 1;
  }
  else {
    iVar1 = ioctl(this->m_fd,0x80685600,(undefined1 *)((long)&fmt.fmt + 0xc0));
    if (iVar1 < 0) {
      perror("Intel_V4L2::init_device : VIDIOC_QUERYCAP : ");
      this_local._4_4_ = 1;
    }
    else {
      req.capabilities = 1;
      fmt.type = 0x280;
      fmt._4_4_ = 0x1e0;
      fmt.fmt.pix.width = 0x20493859;
      fmt.fmt.pix.height = 1;
      iVar1 = ioctl(this->m_fd,0xc0d05605,&req.capabilities);
      if (iVar1 < 0) {
        perror("Intel_V4L2::init_device : VIDIOC_S_FMT : ");
        this_local._4_4_ = 1;
      }
      else {
        memset((void *)((long)&streamParm.parm + 0xc0),0,0x14);
        streamParm.parm._192_4_ = 1;
        streamParm.parm._196_4_ = 1;
        req.count = 2;
        iVar1 = ioctl(this->m_fd,0xc0145608,(undefined1 *)((long)&streamParm.parm + 0xc0));
        if (iVar1 < 0) {
          perror("Intel_V4L2::init_device : VIDIOC_REQBUFS : ");
          this_local._4_4_ = 1;
        }
        else {
          memset(&buf.field_12,0,0xcc);
          buf.field_12.request_fd = 1;
          buf._84_4_ = 0x1000;
          streamParm.type = 0;
          streamParm.parm.capture.capability = 1;
          streamParm.parm.capture.capturemode = 6;
          streamParm.parm.capture.timeperframe.numerator = 0;
          streamParm.parm.capture.timeperframe.denominator = 0;
          iVar1 = ioctl(this->m_fd,0xc0cc5616,&buf.field_12);
          if (iVar1 < 0) {
            perror("Intel_V4L2::init_device : VIDIOC_S_PARM : ");
            this_local._4_4_ = 1;
          }
          else {
            memset(&local_288,0,0x58);
            local_284 = 1;
            buf.timecode.userbits[0] = '\x02';
            buf.timecode.userbits[1] = '\0';
            buf.timecode.userbits[2] = '\0';
            buf.timecode.userbits[3] = '\0';
            local_288 = 0;
            iVar1 = ioctl(this->m_fd,0xc0585609,&local_288);
            if (iVar1 < 0) {
              perror("Intel_V4L2::init_device : VIDIOC_QUERYBUF : ");
              this_local._4_4_ = 1;
            }
            else {
              this->m_bigBufferLength = 0x708400;
              puVar2 = (uchar *)malloc((long)this->m_bigBufferLength);
              this->m_pBigBuffer = puVar2;
              if (this->m_pBigBuffer == (uchar *)0x0) {
                __assert_fail("NULL != m_pBigBuffer",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/temburuyk[P]visual_odom/src/rgbd_standalone.cpp"
                              ,0x7c,"int Intel_V4L2::init_device()");
              }
              memset(this->m_pBigBuffer,0,(long)this->m_bigBufferLength);
              pvVar3 = (v4l2_buffer *)calloc(1,0x58);
              this->m_pV4l2Buffer = pvVar3;
              this->m_pV4l2Buffer->type = 1;
              this->m_pV4l2Buffer->memory = 2;
              this->m_pV4l2Buffer->index = 0;
              this->m_pV4l2Buffer->m = (anon_union_8_4_434ee044_for_m)this->m_pBigBuffer;
              this->m_pV4l2Buffer->length = this->m_bigBufferLength;
              this->m_bufType = this->m_pV4l2Buffer->type;
              iVar1 = ioctl(this->m_fd,0x40045612,&this->m_bufType);
              if (iVar1 < 0) {
                perror("Intel_V4L2::init_device : VIDIOC_STREAMON");
                this_local._4_4_ = 1;
              }
              else {
                this_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Intel_V4L2::init_device () {

    // Intel RGBD ir frames @/dev/video1 (Interlaced left and right)
    m_fd = open ("/dev/video1", O_RDWR);
    if (0 > m_fd) {
        perror ("Intel_V4L2::init_device : failed to open /dev/video1");
        return 1;
    }

    struct v4l2_capability cap;
    if (0 > ioctl (m_fd, VIDIOC_QUERYCAP, &cap)) {
        perror ("Intel_V4L2::init_device : VIDIOC_QUERYCAP : ");
        return 1;
    }

    // Image format parameters :
    struct v4l2_format fmt;
    fmt.type                = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    fmt.fmt.pix.width       = 640;
    fmt.fmt.pix.height      = 480;
    fmt.fmt.pix.pixelformat = v4l2_fourcc('Y', '8', 'I', ' ');
    fmt.fmt.pix.field       = V4L2_FIELD_NONE;
    if (0 > ioctl (m_fd, VIDIOC_S_FMT, &fmt)) {
        perror ("Intel_V4L2::init_device : VIDIOC_S_FMT : ");
        return 1;
    }

    // Setup buffers. For RGBD, need to use memory buffer obtained from malloc.
    struct v4l2_requestbuffers req = {0};
    req.count   = 1;
    req.type    = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    // req.memory = V4L2_MEMORY_MMAP;
    req.memory = V4L2_MEMORY_USERPTR;

    if (0 > ioctl (m_fd, VIDIOC_REQBUFS, &req)) {
        perror ("Intel_V4L2::init_device : VIDIOC_REQBUFS : ");
        return 1;
    }

    // Set Frame-rate. Need to be very slow.
    struct v4l2_streamparm streamParm = {0};
    // struct v4l2_captureparm
    // capability=V4L2_CAP_TIMEPERFRAME, capturemode=0, timeperframe=1/6, extendedmode=0, readbuffers=0
    streamParm.type                      = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    streamParm.parm.capture.capability   = V4L2_CAP_TIMEPERFRAME;
    streamParm.parm.capture.capturemode  = 0;
    streamParm.parm.capture.timeperframe.numerator   = 1;
    streamParm.parm.capture.timeperframe.denominator = 6;
    streamParm.parm.capture.extendedmode = 0;
    streamParm.parm.capture.readbuffers  = 0;
    if (0 > ioctl (m_fd, VIDIOC_S_PARM, &streamParm)) {
        perror ("Intel_V4L2::init_device : VIDIOC_S_PARM : ");
        return 1;
    }

    v4l2_buffer buf = {0};
    buf.type    = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    buf.memory  = V4L2_MEMORY_USERPTR;
    buf.index   = 0;
    if (0 > ioctl (m_fd, VIDIOC_QUERYBUF, &buf)) {
        perror ("Intel_V4L2::init_device : VIDIOC_QUERYBUF : ");
        return 1;
    }

    // Allocate a big buffer once.
    m_bigBufferLength = 1280 * 720 * 4 * 2 + 1024;
    m_pBigBuffer = (unsigned char *) malloc (m_bigBufferLength);
    assert (NULL != m_pBigBuffer);
    memset (m_pBigBuffer, 0, m_bigBufferLength);

    m_pV4l2Buffer = (v4l2_buffer *) calloc (1, sizeof (v4l2_buffer));
    m_pV4l2Buffer->type       = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    m_pV4l2Buffer->memory     = V4L2_MEMORY_USERPTR;
    m_pV4l2Buffer->index      = 0;
    m_pV4l2Buffer->m.userptr  = (unsigned long) m_pBigBuffer;
    m_pV4l2Buffer->length     = m_bigBufferLength;

    // USB-UVC streaming:
    m_bufType = m_pV4l2Buffer->type;
    if (0 > ioctl (m_fd, VIDIOC_STREAMON, &m_bufType)) {
        perror ("Intel_V4L2::init_device : VIDIOC_STREAMON");
        return 1;
    }

    return 0;
}